

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gears_engine.c
# Opt level: O1

char * gears_engine_name(int opt)

{
  list *plVar1;
  int iVar2;
  
  if (engine_list.next == &engine_list) {
    return (char *)0x0;
  }
  iVar2 = opt + 1;
  plVar1 = engine_list.next;
  do {
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      return (char *)plVar1[-3].prev;
    }
    plVar1 = plVar1->next;
  } while (plVar1 != &engine_list);
  return (char *)0x0;
}

Assistant:

char *gears_engine_name(int opt)
{
  int nb = 0;
  engine_t *engine = NULL;
  struct list *engine_entry = NULL;

  LIST_FOR_EACH(engine_entry, &engine_list) {
    engine = LIST_ENTRY(engine_entry, engine_t, entry);
    if (nb == opt) {
      return engine->name;
    }
    nb++;
  }

  return NULL;
}